

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O3

part_head_t * __thiscall
async_simple::coro::detail::LazyAwaiterBase<cinatra::part_head_t>::awaitResume
          (part_head_t *__return_storage_ptr__,LazyAwaiterBase<cinatra::part_head_t> *this)

{
  size_type sVar1;
  error_category *peVar2;
  int iVar3;
  undefined4 uVar4;
  part_head_t *ppVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_type *local_68;
  size_type local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  size_type *local_48;
  size_type local_40;
  size_type local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  ppVar5 = LazyPromise<cinatra::part_head_t>::result
                     ((LazyPromise<cinatra::part_head_t> *)((long)(this->_handle).__handle_ + 0x10))
  ;
  iVar3 = (ppVar5->ec)._M_value;
  uVar4 = *(undefined4 *)&(ppVar5->ec).field_0x4;
  peVar2 = (ppVar5->ec)._M_cat;
  local_68 = (size_type *)(ppVar5->name)._M_dataplus._M_p;
  paVar6 = &(ppVar5->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68 == paVar6) {
    local_58 = paVar6->_M_allocated_capacity;
    uStack_50 = *(undefined4 *)((long)&(ppVar5->name).field_2 + 8);
    uStack_4c = *(undefined4 *)((long)&(ppVar5->name).field_2 + 0xc);
    local_68 = &local_58;
  }
  else {
    local_58 = paVar6->_M_allocated_capacity;
  }
  sVar1 = (ppVar5->name)._M_string_length;
  (ppVar5->name)._M_dataplus._M_p = (pointer)paVar6;
  (ppVar5->name)._M_string_length = 0;
  (ppVar5->name).field_2._M_local_buf[0] = '\0';
  local_48 = (size_type *)(ppVar5->filename)._M_dataplus._M_p;
  paVar6 = &(ppVar5->filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48 == paVar6) {
    local_38 = paVar6->_M_allocated_capacity;
    uStack_30 = *(undefined4 *)((long)&(ppVar5->filename).field_2 + 8);
    uStack_2c = *(undefined4 *)((long)&(ppVar5->filename).field_2 + 0xc);
    local_48 = &local_38;
  }
  else {
    local_38 = paVar6->_M_allocated_capacity;
  }
  local_40 = (ppVar5->filename)._M_string_length;
  (ppVar5->filename)._M_dataplus._M_p = (pointer)paVar6;
  (ppVar5->filename)._M_string_length = 0;
  (ppVar5->filename).field_2._M_local_buf[0] = '\0';
  (**(code **)((long)(this->_handle).__handle_ + 8))();
  (this->_handle).__handle_ = (void *)0x0;
  (__return_storage_ptr__->ec)._M_value = iVar3;
  *(undefined4 *)&(__return_storage_ptr__->ec).field_0x4 = uVar4;
  (__return_storage_ptr__->ec)._M_cat = peVar2;
  paVar6 = &(__return_storage_ptr__->name).field_2;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)paVar6;
  if (local_68 == &local_58) {
    paVar6->_M_allocated_capacity = local_58;
    *(ulong *)((long)&(__return_storage_ptr__->name).field_2 + 8) = CONCAT44(uStack_4c,uStack_50);
  }
  else {
    (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)local_68;
    (__return_storage_ptr__->name).field_2._M_allocated_capacity = local_58;
  }
  (__return_storage_ptr__->name)._M_string_length = sVar1;
  paVar6 = &(__return_storage_ptr__->filename).field_2;
  (__return_storage_ptr__->filename)._M_dataplus._M_p = (pointer)paVar6;
  if (local_48 == &local_38) {
    paVar6->_M_allocated_capacity = local_38;
    *(ulong *)((long)&(__return_storage_ptr__->filename).field_2 + 8) =
         CONCAT44(uStack_2c,uStack_30);
  }
  else {
    (__return_storage_ptr__->filename)._M_dataplus._M_p = (pointer)local_48;
    (__return_storage_ptr__->filename).field_2._M_allocated_capacity = local_38;
  }
  (__return_storage_ptr__->filename)._M_string_length = local_40;
  return __return_storage_ptr__;
}

Assistant:

auto awaitResume() {
        if constexpr (std::is_void_v<T>) {
            _handle.promise().result();
            // We need to destroy the handle expclictly since the awaited
            // coroutine after symmetric transfer couldn't release it self any
            // more.
            _handle.destroy();
            _handle = nullptr;
        } else {
            auto r = std::move(_handle.promise()).result();
            _handle.destroy();
            _handle = nullptr;
            return r;
        }
    }